

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser_common.c
# Opt level: O2

LY_ERR lysp_stmt_augment(lysp_ctx *ctx,lysp_stmt *stmt,lysp_node *parent,
                        lysp_node_augment **augments)

{
  lysp_ext_instance **exts;
  lysp_node **siblings;
  ly_stmt stmt_00;
  lysp_node_augment *plVar1;
  lysp_stmt *stmt_01;
  lyd_node *plVar2;
  LY_ERR LVar3;
  LY_ERR LVar4;
  lysp_node_augment *parent_00;
  lysp_node_augment *plVar5;
  char *pcVar6;
  char *format;
  uint32_t substmt_index;
  ly_ctx *plVar7;
  lysp_ext_instance **in_R8;
  lysp_ext_instance **in_R9;
  lysp_stmt **pplVar8;
  
  LVar3 = lysp_stmt_validate_value(ctx,Y_STR_ARG,stmt->arg);
  if (LVar3 == LY_SUCCESS) {
    parent_00 = (lysp_node_augment *)calloc(1,0x60);
    if (parent_00 == (lysp_node_augment *)0x0) {
      if (ctx == (lysp_ctx *)0x0) {
        plVar7 = (ly_ctx *)0x0;
      }
      else {
        plVar7 = (ly_ctx *)
                 **(undefined8 **)(ctx->parsed_mods->field_2).dnodes[ctx->parsed_mods->count - 1];
      }
      LVar3 = LY_EMEM;
      ly_log(plVar7,LY_LLERR,LY_EMEM,"Memory allocation failed (%s()).","lysp_stmt_augment");
    }
    else {
      plVar1 = *augments;
      if (*augments != (lysp_node_augment *)0x0) {
        do {
          plVar5 = plVar1;
          plVar1 = (lysp_node_augment *)(plVar5->field_0).node.next;
        } while (plVar1 != (lysp_node_augment *)0x0);
        augments = &(plVar5->field_0).field_1.next;
      }
      *augments = parent_00;
      if (ctx == (lysp_ctx *)0x0) {
        plVar7 = (ly_ctx *)0x0;
      }
      else {
        plVar7 = (ly_ctx *)
                 **(undefined8 **)(ctx->parsed_mods->field_2).dnodes[ctx->parsed_mods->count - 1];
      }
      LVar3 = lydict_insert(plVar7,stmt->arg,0,&(parent_00->field_0).node.name);
      if (LVar3 == LY_SUCCESS) {
        (parent_00->field_0).node.nodetype = 0x8000;
        (parent_00->field_0).node.parent = parent;
        exts = &(parent_00->field_0).node.exts;
        siblings = &parent_00->child;
        LVar3 = LY_SUCCESS;
        pplVar8 = &stmt->child;
        while (stmt_01 = *pplVar8, stmt_01 != (lysp_stmt *)0x0) {
          stmt_00 = stmt_01->kw;
          if (stmt_00 == LY_STMT_NOTIFICATION) {
            plVar2 = (ctx->parsed_mods->field_2).dnodes[ctx->parsed_mods->count - 1];
            if (*(byte *)&plVar2[2].schema < 2) {
              plVar7 = (ly_ctx *)**(undefined8 **)plVar2;
              pcVar6 = "notification";
LAB_00164de0:
              format = 
              "Invalid keyword \"%s\" as a child of \"%s\" - the statement is allowed only in YANG 1.1 modules."
              ;
LAB_00164e0e:
              ly_vlog(plVar7,(char *)0x0,LYVE_SYNTAX_YANG,format,pcVar6,"augment");
              return LY_EVALID;
            }
            LVar4 = lysp_stmt_notif(ctx,stmt_01,(lysp_node *)parent_00,&parent_00->notifs);
          }
          else if (stmt_00 == LY_STMT_ACTION) {
            plVar2 = (ctx->parsed_mods->field_2).dnodes[ctx->parsed_mods->count - 1];
            if (*(byte *)&plVar2[2].schema < 2) {
              plVar7 = (ly_ctx *)**(undefined8 **)plVar2;
              pcVar6 = "action";
              goto LAB_00164de0;
            }
            LVar4 = lysp_stmt_action(ctx,stmt_01,(lysp_node *)parent_00,&parent_00->actions);
          }
          else {
            if (stmt_00 == LY_STMT_ANYDATA) {
              plVar2 = (ctx->parsed_mods->field_2).dnodes[ctx->parsed_mods->count - 1];
              if (*(byte *)&plVar2[2].schema < 2) {
                plVar7 = (ly_ctx *)**(undefined8 **)plVar2;
                pcVar6 = "anydata";
                goto LAB_00164de0;
              }
            }
            else if (stmt_00 != LY_STMT_ANYXML) {
              if (stmt_00 == LY_STMT_CASE) {
                LVar4 = lysp_stmt_case(ctx,stmt_01,(lysp_node *)parent_00,siblings);
              }
              else if (stmt_00 == LY_STMT_CHOICE) {
                LVar4 = lysp_stmt_choice(ctx,stmt_01,(lysp_node *)parent_00,siblings);
              }
              else if (stmt_00 == LY_STMT_CONTAINER) {
                LVar4 = lysp_stmt_container(ctx,stmt_01,(lysp_node *)parent_00,siblings);
              }
              else if (stmt_00 == LY_STMT_LEAF) {
                LVar4 = lysp_stmt_leaf(ctx,stmt_01,(lysp_node *)parent_00,siblings);
              }
              else if (stmt_00 == LY_STMT_LEAF_LIST) {
                LVar4 = lysp_stmt_leaflist(ctx,stmt_01,(lysp_node *)parent_00,siblings);
              }
              else if (stmt_00 == LY_STMT_LIST) {
                LVar4 = lysp_stmt_list(ctx,stmt_01,(lysp_node *)parent_00,siblings);
              }
              else if (stmt_00 == LY_STMT_USES) {
                LVar4 = lysp_stmt_uses(ctx,stmt_01,(lysp_node *)parent_00,siblings);
              }
              else if (stmt_00 == LY_STMT_WHEN) {
                LVar4 = lysp_stmt_when(ctx,stmt_01,&parent_00->when);
              }
              else if (stmt_00 == LY_STMT_EXTENSION_INSTANCE) {
                in_R8 = exts;
                LVar4 = lysp_stmt_ext(ctx,stmt_01,LY_STMT_AUGMENT,0,exts);
              }
              else if (stmt_00 == LY_STMT_IF_FEATURE) {
                LVar4 = lysp_stmt_qnames(ctx,stmt_01,&(parent_00->field_0).node.iffeatures,
                                         (yang_arg)exts,in_R8);
              }
              else {
                substmt_index = (int)parent_00 + 0x28;
                if (stmt_00 != LY_STMT_REFERENCE) {
                  if (stmt_00 == LY_STMT_STATUS) {
                    LVar4 = lysp_stmt_status(ctx,stmt_01,&(parent_00->field_0).node.flags,exts);
                    goto LAB_00164d4c;
                  }
                  substmt_index = (int)parent_00 + 0x20;
                  if (stmt_00 != LY_STMT_DESCRIPTION) {
                    if (ctx == (lysp_ctx *)0x0) {
                      plVar7 = (ly_ctx *)0x0;
                    }
                    else {
                      plVar7 = (ly_ctx *)
                               **(undefined8 **)
                                 (ctx->parsed_mods->field_2).dnodes[ctx->parsed_mods->count - 1];
                    }
                    pcVar6 = lyplg_ext_stmt2str(stmt_00);
                    format = "Invalid keyword \"%s\" as a child of \"%s\".";
                    goto LAB_00164e0e;
                  }
                }
                in_R8 = exts;
                LVar4 = lysp_stmt_text_field
                                  (ctx,stmt_01,substmt_index,(char **)0x2,(yang_arg)exts,in_R9);
              }
              goto LAB_00164d4c;
            }
            LVar4 = lysp_stmt_any(ctx,stmt_01,(lysp_node *)parent_00,siblings);
          }
LAB_00164d4c:
          if (LVar4 != LY_SUCCESS) {
            return LVar4;
          }
          pplVar8 = &stmt_01->next;
        }
      }
    }
  }
  return LVar3;
}

Assistant:

static LY_ERR
lysp_stmt_augment(struct lysp_ctx *ctx, const struct lysp_stmt *stmt, struct lysp_node *parent,
        struct lysp_node_augment **augments)
{
    struct lysp_node_augment *aug;

    LY_CHECK_RET(lysp_stmt_validate_value(ctx, Y_STR_ARG, stmt->arg));

    LY_LIST_NEW_RET(PARSER_CTX(ctx), augments, aug, next, LY_EMEM);

    LY_CHECK_RET(lydict_insert(PARSER_CTX(ctx), stmt->arg, 0, &aug->nodeid));
    aug->nodetype = LYS_AUGMENT;
    aug->parent = parent;

    for (const struct lysp_stmt *child = stmt->child; child; child = child->next) {
        switch (child->kw) {
        case LY_STMT_DESCRIPTION:
            LY_CHECK_RET(lysp_stmt_text_field(ctx, child, 0, &aug->dsc, Y_STR_ARG, &aug->exts));
            break;
        case LY_STMT_IF_FEATURE:
            LY_CHECK_RET(lysp_stmt_qnames(ctx, child, &aug->iffeatures, Y_STR_ARG, &aug->exts));
            break;
        case LY_STMT_REFERENCE:
            LY_CHECK_RET(lysp_stmt_text_field(ctx, child, 0, &aug->ref, Y_STR_ARG, &aug->exts));
            break;
        case LY_STMT_STATUS:
            LY_CHECK_RET(lysp_stmt_status(ctx, child, &aug->flags, &aug->exts));
            break;
        case LY_STMT_WHEN:
            LY_CHECK_RET(lysp_stmt_when(ctx, child, &aug->when));
            break;

        case LY_STMT_ANYDATA:
            PARSER_CHECK_STMTVER2_RET(ctx, "anydata", "augment");
        /* fall through */
        case LY_STMT_ANYXML:
            LY_CHECK_RET(lysp_stmt_any(ctx, child, &aug->node, &aug->child));
            break;
        case LY_STMT_CASE:
            LY_CHECK_RET(lysp_stmt_case(ctx, child, &aug->node, &aug->child));
            break;
        case LY_STMT_CHOICE:
            LY_CHECK_RET(lysp_stmt_choice(ctx, child, &aug->node, &aug->child));
            break;
        case LY_STMT_CONTAINER:
            LY_CHECK_RET(lysp_stmt_container(ctx, child, &aug->node, &aug->child));
            break;
        case LY_STMT_LEAF:
            LY_CHECK_RET(lysp_stmt_leaf(ctx, child, &aug->node, &aug->child));
            break;
        case LY_STMT_LEAF_LIST:
            LY_CHECK_RET(lysp_stmt_leaflist(ctx, child, &aug->node, &aug->child));
            break;
        case LY_STMT_LIST:
            LY_CHECK_RET(lysp_stmt_list(ctx, child, &aug->node, &aug->child));
            break;
        case LY_STMT_USES:
            LY_CHECK_RET(lysp_stmt_uses(ctx, child, &aug->node, &aug->child));
            break;

        case LY_STMT_ACTION:
            PARSER_CHECK_STMTVER2_RET(ctx, "action", "augment");
            LY_CHECK_RET(lysp_stmt_action(ctx, child, &aug->node, &aug->actions));
            break;
        case LY_STMT_NOTIFICATION:
            PARSER_CHECK_STMTVER2_RET(ctx, "notification", "augment");
            LY_CHECK_RET(lysp_stmt_notif(ctx, child, &aug->node, &aug->notifs));
            break;
        case LY_STMT_EXTENSION_INSTANCE:
            LY_CHECK_RET(lysp_stmt_ext(ctx, child, LY_STMT_AUGMENT, 0, &aug->exts));
            break;
        default:
            LOGVAL_PARSER(ctx, LY_VCODE_INCHILDSTMT, lyplg_ext_stmt2str(child->kw), "augment");
            return LY_EVALID;
        }
    }

    return LY_SUCCESS;
}